

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O1

void ncnn::convdw3x3s1_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_dequant,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  pointer pfVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  uint uVar14;
  long lVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  uint uVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  void *pvVar24;
  void *pvVar25;
  long lVar26;
  void *pvVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  void *pvVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int size;
  
  auVar17 = _DAT_005910a0;
  auVar16 = _DAT_00591080;
  iVar2 = top_blob->c;
  if (0 < (long)iVar2) {
    iVar3 = top_blob->w;
    iVar4 = top_blob->h;
    pvVar6 = _kernel->data;
    pvVar7 = _bias->data;
    iVar5 = bottom_blob->w;
    lVar23 = (long)top_blob->h * (long)top_blob->w;
    pvVar8 = top_blob->data;
    uVar9 = top_blob->elemsize;
    lVar20 = top_blob->cstep * uVar9;
    lVar28 = 0;
    iVar22 = (int)((uVar9 * lVar23 + 0xf & 0xfffffffffffffff0) / uVar9);
    if (top_blob->dims == 4) {
      iVar22 = (int)lVar23;
    }
    uVar18 = iVar22 * top_blob->d;
    pfVar10 = (scales_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start;
    sVar11 = bottom_blob->cstep;
    sVar12 = bottom_blob->elemsize;
    pvVar13 = bottom_blob->data;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = (ulong)uVar18 - 1;
    auVar32 = vpshufd_avx(auVar32,0x44);
    uVar9 = auVar32._0_8_;
    auVar33._0_8_ = uVar9 ^ 0x8000000000000000;
    auVar33._8_4_ = auVar32._8_4_;
    uVar14 = auVar32._12_4_;
    auVar33._12_4_ = uVar14 ^ 0x80000000;
    auVar32 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
    pvVar31 = pvVar8;
    do {
      if (pvVar7 == (void *)0x0) {
        auVar34 = ZEXT816(0) << 0x40;
      }
      else {
        auVar34 = ZEXT416(*(uint *)((long)pvVar7 + lVar28 * 4));
      }
      fVar1 = pfVar10[lVar28];
      if (0 < (int)uVar18) {
        auVar34 = vshufps_avx(auVar34,auVar34,0);
        auVar35._16_16_ = auVar34;
        auVar35._0_16_ = auVar34;
        uVar21 = 0;
        do {
          auVar34._8_8_ = 0;
          auVar34._0_8_ = uVar21;
          auVar34 = vpshufd_avx(auVar34,0x44);
          auVar37._16_16_ = auVar34;
          auVar37._0_16_ = auVar34;
          auVar38 = vorps_avx(auVar37,auVar16);
          auVar37 = vorps_avx(auVar37,auVar17);
          auVar40._0_8_ = auVar37._16_8_ ^ 0x8000000000000000;
          auVar40._8_4_ = auVar37._24_4_;
          auVar40._12_4_ = auVar37._28_4_ ^ 0x80000000;
          auVar34 = vpcmpgtq_avx(auVar40,auVar33);
          auVar42._0_8_ = uVar9 ^ 0x8000000000000000;
          auVar42._8_4_ = auVar33._8_4_;
          auVar42._12_4_ = uVar14 ^ 0x80000000;
          auVar36._0_8_ = auVar37._0_8_ ^ 0x8000000000000000;
          auVar36._8_4_ = auVar37._8_4_;
          auVar36._12_4_ = auVar37._12_4_ ^ 0x80000000;
          auVar36 = vpcmpgtq_avx(auVar36,auVar42);
          auVar34 = vpackssdw_avx(auVar36,auVar34);
          auVar41._0_8_ = auVar38._16_8_ ^ 0x8000000000000000;
          auVar41._8_4_ = auVar38._24_4_;
          auVar41._12_4_ = auVar38._28_4_ ^ 0x80000000;
          auVar36 = vpcmpgtq_avx(auVar41,auVar33);
          auVar43._0_8_ = uVar9 ^ 0x8000000000000000;
          auVar43._8_4_ = auVar33._8_4_;
          auVar43._12_4_ = uVar14 ^ 0x80000000;
          auVar39._0_8_ = auVar38._0_8_ ^ 0x8000000000000000;
          auVar39._8_4_ = auVar38._8_4_;
          auVar39._12_4_ = auVar38._12_4_ ^ 0x80000000;
          auVar39 = vpcmpgtq_avx(auVar39,auVar43);
          auVar36 = vpackssdw_avx(auVar39,auVar36);
          auVar34 = vpackssdw_avx(auVar36 ^ auVar32,auVar34 ^ auVar32);
          auVar36 = vpmovsxwd_avx(auVar34);
          auVar34 = vpunpckhwd_avx(auVar34,auVar34);
          auVar38._16_16_ = auVar34;
          auVar38._0_16_ = auVar36;
          auVar38 = vmaskmovps_avx(auVar38,auVar35);
          *(undefined1 (*) [32])((long)pvVar31 + uVar21 * 4) = auVar38;
          uVar21 = uVar21 + 8;
        } while ((uVar18 + 7 & 0xfffffff8) != uVar21);
      }
      if (0 < iVar4) {
        pvVar27 = (void *)(lVar20 * lVar28 + (long)pvVar8);
        lVar15 = lVar28 * 9;
        pvVar24 = (void *)(sVar11 * sVar12 * lVar28 + (long)pvVar13);
        pvVar25 = (void *)((long)pvVar24 + (long)iVar5 * 2);
        lVar23 = (long)pvVar24 + (long)iVar5;
        iVar22 = 0;
        do {
          if (0 < iVar3) {
            lVar30 = 2;
            lVar26 = 0;
            lVar29 = 0;
            iVar19 = iVar3 + 1;
            do {
              *(float *)((long)pvVar27 + lVar30 * 4 + -8) =
                   fVar1 * (float)((int)*(char *)((long)pvVar6 + lVar15 + 8) *
                                   (int)*(char *)((long)pvVar25 + lVar30) +
                                   (int)*(char *)((long)pvVar6 + lVar15 + 7) *
                                   (int)*(char *)((long)pvVar25 + lVar30 + -1) +
                                  (int)*(char *)((long)pvVar6 + lVar15 + 6) *
                                  (int)*(char *)((long)pvVar25 + lVar30 + -2) +
                                  (int)*(char *)((long)pvVar6 + lVar15 + 5) *
                                  (int)*(char *)(lVar23 + lVar30) +
                                  (int)*(char *)((long)pvVar6 + lVar15 + 4) *
                                  (int)*(char *)(lVar23 + -1 + lVar30) +
                                  (int)*(char *)((long)pvVar6 + lVar15 + 3) *
                                  (int)*(char *)(lVar23 + -2 + lVar30) +
                                  (int)*(char *)((long)pvVar6 + lVar15 + 2) *
                                  (int)*(char *)((long)pvVar24 + lVar30) +
                                  (int)*(char *)((long)pvVar6 + lVar15 + 1) *
                                  (int)*(char *)((long)pvVar24 + lVar30 + -1) +
                                  (int)*(char *)((long)pvVar6 + lVar15) *
                                  (int)*(char *)((long)pvVar24 + lVar30 + -2)) +
                   *(float *)((long)pvVar27 + lVar30 * 4 + -8);
              iVar19 = iVar19 + -1;
              lVar29 = lVar29 + -1;
              lVar30 = lVar30 + 1;
              lVar26 = lVar26 + -4;
            } while (1 < iVar19);
            pvVar25 = (void *)((long)pvVar25 - lVar29);
            lVar23 = lVar23 - lVar29;
            pvVar24 = (void *)((long)pvVar24 - lVar29);
            pvVar27 = (void *)((long)pvVar27 - lVar26);
          }
          pvVar24 = (void *)((long)pvVar24 + 2);
          lVar23 = lVar23 + 2;
          pvVar25 = (void *)((long)pvVar25 + 2);
          iVar22 = iVar22 + 1;
        } while (iVar22 != iVar4);
      }
      lVar28 = lVar28 + 1;
      pvVar31 = (void *)((long)pvVar31 + lVar20);
    } while (lVar28 != iVar2);
  }
  return;
}

Assistant:

static void convdw3x3s1_int8_dequant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, std::vector<float> scales_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        float* outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_dequant = scales_dequant[p];

        out.fill(bias0);

        const signed char* kernel0 = (const signed char*)kernel + p * 9;

        const signed char* img0 = bottom_blob.channel(p);
        const signed char* r0 = img0;
        const signed char* r1 = img0 + w;
        const signed char* r2 = img0 + w * 2;

        int i = 0;
        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr += (float)sum * scale_dequant;

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}